

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_intrin_avx2.c
# Opt level: O0

void av1_block_error_block_size32_avx2(int16_t *coeff,int16_t *dqcoeff,__m256i *sse_256)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  __m256i sum_temp_0;
  __m256i exp0_error_hi;
  __m256i exp0_error_lo;
  __m256i err_final_0;
  __m256i error_1;
  __m256i error_0;
  __m256i diff_1;
  __m256i diff_0;
  __m256i _dqcoeff_1;
  __m256i _coeff_1;
  __m256i _dqcoeff_0;
  __m256i _coeff_0;
  __m256i zero;
  
  auVar1 = vpsubw_avx2(*in_RSI,*in_RDI);
  auVar2 = vpsubw_avx2(in_RSI[1],in_RDI[1]);
  auVar1 = vpmaddwd_avx2(auVar1,auVar1);
  auVar2 = vpmaddwd_avx2(auVar2,auVar2);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  auVar2 = vpunpckldq_avx2(auVar1,ZEXT1632(ZEXT816(0)));
  auVar1 = vpunpckhdq_avx2(auVar1,ZEXT1632(ZEXT816(0)));
  auVar1 = vpaddq_avx2(auVar1,auVar2);
  auVar1 = vpaddq_avx2(*in_RDX,auVar1);
  *in_RDX = auVar1;
  return;
}

Assistant:

static inline void av1_block_error_block_size32_avx2(const int16_t *coeff,
                                                     const int16_t *dqcoeff,
                                                     __m256i *sse_256) {
  const __m256i zero = _mm256_setzero_si256();
  const __m256i _coeff_0 = _mm256_loadu_si256((const __m256i *)coeff);
  const __m256i _dqcoeff_0 = _mm256_loadu_si256((const __m256i *)dqcoeff);
  const __m256i _coeff_1 = _mm256_loadu_si256((const __m256i *)(coeff + 16));
  const __m256i _dqcoeff_1 =
      _mm256_loadu_si256((const __m256i *)(dqcoeff + 16));

  // d0 d1 d2 d3 d4 d5 d6 d7 d8 d9 d10 d11 d12 d13 d14 d15
  const __m256i diff_0 = _mm256_sub_epi16(_dqcoeff_0, _coeff_0);
  const __m256i diff_1 = _mm256_sub_epi16(_dqcoeff_1, _coeff_1);

  // r0 r1 r2 r3 r4 r5 r6 r7
  const __m256i error_0 = _mm256_madd_epi16(diff_0, diff_0);
  const __m256i error_1 = _mm256_madd_epi16(diff_1, diff_1);
  const __m256i err_final_0 = _mm256_add_epi32(error_0, error_1);

  // For extreme input values, the accumulation needs to happen in 64 bit
  // precision to avoid any overflow.
  const __m256i exp0_error_lo = _mm256_unpacklo_epi32(err_final_0, zero);
  const __m256i exp0_error_hi = _mm256_unpackhi_epi32(err_final_0, zero);
  const __m256i sum_temp_0 = _mm256_add_epi64(exp0_error_hi, exp0_error_lo);
  *sse_256 = _mm256_add_epi64(*sse_256, sum_temp_0);
}